

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O1

string_view __thiscall wabt::GetExtension(wabt *this,string_view filename)

{
  wabt *pwVar1;
  char *pcVar2;
  wabt *pwVar3;
  char *extraout_RDX;
  uint uVar5;
  char *pcVar6;
  string_view sVar7;
  string_view sVar8;
  wabt *pwVar4;
  
  pwVar4 = this;
  if (this == (wabt *)0x0) {
LAB_00121ba0:
    pwVar3 = (wabt *)0xffffffffffffffff;
  }
  else {
    do {
      pwVar3 = pwVar4 + -1;
      if (pwVar4 == (wabt *)0x0) goto LAB_00121ba0;
      pwVar1 = pwVar4 + (filename._M_len - 1);
      pwVar4 = pwVar3;
    } while (*pwVar1 != (wabt)0x2e);
  }
  if (pwVar3 == (wabt *)0xffffffffffffffff) {
    pwVar3 = (wabt *)0x12cc01;
    sVar8._M_len = 0;
  }
  else {
    sVar8._M_len = (long)this - (long)pwVar3;
    if (this < pwVar3) {
      pcVar6 = "%s: __pos (which is %zu) > __size (which is %zu)";
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
      sVar8._M_len = 0;
      pcVar2 = (char *)((ulong)pcVar6 & 0xffffffff);
      do {
        pcVar2 = (char *)((ulong)pcVar2 >> 7);
        sVar8._M_len = sVar8._M_len + 1;
        uVar5 = (uint)pcVar6;
        pcVar6 = pcVar2;
      } while (0x7f < uVar5);
      sVar8._M_str = extraout_RDX;
      return sVar8;
    }
    pwVar3 = pwVar3 + filename._M_len;
  }
  sVar7._M_str = (char *)pwVar3;
  sVar7._M_len = sVar8._M_len;
  return sVar7;
}

Assistant:

std::string_view GetExtension(std::string_view filename) {
  size_t pos = filename.find_last_of('.');
  if (pos == std::string_view::npos) {
    return "";
  }
  return filename.substr(pos);
}